

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O3

void rrot1(void *blob,int len,int c)

{
  byte bVar1;
  int byte;
  uint uVar2;
  uint8_t *b;
  ulong uVar3;
  
  if (0 < c) {
    uVar2 = len - 1U & 0x1fffffff;
    uVar3 = (ulong)uVar2;
    do {
      if (len < 1) {
        rshift1(blob,len,1);
LAB_0015eb04:
        if ((int)uVar2 < len) {
          bVar1 = *(byte *)((long)blob + uVar3) & 0x7f;
LAB_0015eb0f:
          *(byte *)((long)blob + uVar3) = bVar1;
        }
      }
      else {
        bVar1 = *blob;
        rshift1(blob,len,1);
        if ((bVar1 & 1) == 0) goto LAB_0015eb04;
        if ((int)uVar2 < len) {
          bVar1 = *(byte *)((long)blob + uVar3) | 0x80;
          goto LAB_0015eb0f;
        }
      }
      c = c + -1;
    } while (c != 0);
  }
  return;
}

Assistant:

void rrot1 ( void * blob, int len, int c )
{
  int nbits = len * 8;

  for(int i = 0; i < c; i++)
  {
    uint32_t bit = getbit(blob,len,0);

    rshift1(blob,len,1);

    setbit(blob,len,nbits-1,bit);
  }
}